

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydata.h
# Opt level: O0

pair<QTypedArrayData<std::pair<QModelIndex,_QPersistentModelIndex>_>_*,_std::pair<QModelIndex,_QPersistentModelIndex>_*>
 QTypedArrayData<std::pair<QModelIndex,_QPersistentModelIndex>_>::allocate
           (qsizetype capacity,AllocationOption option)

{
  pair<QTypedArrayData<std::pair<QModelIndex,_QPersistentModelIndex>_>_*,_std::pair<QModelIndex,_QPersistentModelIndex>_*>
  pVar1;
  undefined4 in_ESI;
  QArrayData **in_RDI;
  long in_FS_OFFSET;
  void *result;
  QArrayData *d;
  AllocationOption in_stack_ffffffffffffffac;
  qsizetype in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  pair<QModelIndex,_QPersistentModelIndex> *local_30;
  QTypedArrayData<std::pair<QModelIndex,_QPersistentModelIndex>_> *local_28;
  QTypedArrayData<std::pair<QModelIndex,_QPersistentModelIndex>_> *local_20;
  pair<QTypedArrayData<std::pair<QModelIndex,_QPersistentModelIndex>_>_*,_std::pair<QModelIndex,_QPersistentModelIndex>_*>
  local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = (QTypedArrayData<std::pair<QModelIndex,_QPersistentModelIndex>_> *)
             &DAT_aaaaaaaaaaaaaaaa;
  local_30 = (pair<QModelIndex,_QPersistentModelIndex> *)
             QArrayData::allocate
                       (in_RDI,CONCAT44(in_ESI,in_stack_ffffffffffffffc0),-0x5555555555555556,
                        in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  local_28 = local_20;
  std::
  pair<QTypedArrayData<std::pair<QModelIndex,_QPersistentModelIndex>_>_*,_std::pair<QModelIndex,_QPersistentModelIndex>_*>
  ::
  pair<QTypedArrayData<std::pair<QModelIndex,_QPersistentModelIndex>_>_*,_std::pair<QModelIndex,_QPersistentModelIndex>_*,_true>
            (&local_18,&local_28,&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    pVar1.second = local_18.second;
    pVar1.first = local_18.first;
    return pVar1;
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] static std::pair<QTypedArrayData *, T *> allocate(qsizetype capacity, AllocationOption option = QArrayData::KeepSize)
    {
        static_assert(sizeof(QTypedArrayData) == sizeof(QArrayData));
        QArrayData *d;
        void *result;
        if constexpr (sizeof(T) == 1) {
            // necessarily, alignof(T) == 1
            result = allocate1(&d, capacity, option);
        } else if constexpr (sizeof(T) == 2) {
            // alignof(T) may be 1, but that makes no difference
            result = allocate2(&d, capacity, option);
        } else {
            result = QArrayData::allocate(&d, sizeof(T), alignof(AlignmentDummy), capacity, option);
        }
#if __has_builtin(__builtin_assume_aligned)
        // and yet we do offer results that have stricter alignment
        result = __builtin_assume_aligned(result, Q_ALIGNOF(AlignmentDummy));
#endif
        return {static_cast<QTypedArrayData *>(d), static_cast<T *>(result)};
    }